

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

void SubtractionHelper<unsigned_long,_signed_char,_5>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_long *lhs,char *rhs,unsigned_long *result)

{
  uint32_t uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)*rhs;
  if ((long)uVar2 < 0) {
    uVar2 = *lhs;
    uVar1 = AbsValueHelper<signed_char,_0>::Abs(*rhs);
    *result = uVar1 + uVar2;
    if (CARRY8((ulong)uVar1,uVar2)) goto LAB_0013a1d0;
  }
  else {
    if (*lhs < uVar2) {
LAB_0013a1d0:
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *result = *lhs - uVar2;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is an std::uint64_t, rhs signed
        // must first see if rhs is positive or negative
        if( rhs >= 0 )
        {
            if( (std::uint64_t)rhs <= lhs )
            {
                result = (T)( lhs - (std::uint64_t)rhs );
                return;
            }
        }
        else
        {
            T tmp = lhs;
            // we're now effectively adding
            result = lhs + AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( rhs );

            if(result >= tmp)
                return;
        }

        E::SafeIntOnOverflow();
    }